

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O0

ngx_int_t ngx_http_log_variable_compile
                    (ngx_conf_t *cf,ngx_http_log_op_t *op,ngx_str_t *value,ngx_uint_t json)

{
  uintptr_t uVar1;
  ngx_int_t index;
  ngx_uint_t json_local;
  ngx_str_t *value_local;
  ngx_http_log_op_t *op_local;
  ngx_conf_t *cf_local;
  
  uVar1 = ngx_http_get_variable_index(cf,value);
  if (uVar1 == 0xffffffffffffffff) {
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    op->len = 0;
    if (json == 0) {
      op->getlen = ngx_http_log_variable_getlen;
      op->run = ngx_http_log_variable;
    }
    else {
      op->getlen = ngx_http_log_json_variable_getlen;
      op->run = ngx_http_log_json_variable;
    }
    op->data = uVar1;
    cf_local = (ngx_conf_t *)0x0;
  }
  return (ngx_int_t)cf_local;
}

Assistant:

static ngx_int_t
ngx_http_log_variable_compile(ngx_conf_t *cf, ngx_http_log_op_t *op,
    ngx_str_t *value, ngx_uint_t json)
{
    ngx_int_t  index;

    index = ngx_http_get_variable_index(cf, value);
    if (index == NGX_ERROR) {
        return NGX_ERROR;
    }

    op->len = 0;

    if (json) {
        op->getlen = ngx_http_log_json_variable_getlen;
        op->run = ngx_http_log_json_variable;

    } else {
        op->getlen = ngx_http_log_variable_getlen;
        op->run = ngx_http_log_variable;
    }

    op->data = index;

    return NGX_OK;
}